

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O3

void __thiscall
LinkedReadsDatastore::LinkedReadsDatastore
          (LinkedReadsDatastore *this,WorkSpace *ws,string *filename,ifstream *infile)

{
  FILE *__stream;
  uint64_t __off;
  ostream *poVar1;
  runtime_error *prVar2;
  long *plVar3;
  size_type *psVar4;
  SDG_FILETYPE type;
  sdgVersion_t version;
  uint64_t s;
  sdgMagic_t magic;
  ushort local_fc;
  ushort local_fa;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  size_type local_d8;
  short local_ca;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  LinkedReadsMapper *local_78;
  string local_70;
  string local_50;
  
  local_a0 = &(this->filename).field_2;
  (this->filename)._M_dataplus._M_p = (pointer)local_a0;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  local_78 = &this->mapper;
  LinkedReadsMapper::LinkedReadsMapper(local_78,ws,this);
  local_a8 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)local_a8;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->default_name)._M_dataplus._M_p = (pointer)&(this->default_name).field_2;
  (this->default_name)._M_string_length = 0;
  (this->default_name).field_2._M_local_buf[0] = '\0';
  (this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->fd = (FILE *)0x0;
  this->ws = ws;
  std::__cxx11::string::_M_assign((string *)filename);
  __stream = fopen((filename->_M_dataplus)._M_p,"r");
  this->fd = (FILE *)__stream;
  fread(&local_ca,2,1,__stream);
  fread(&local_fa,2,1,(FILE *)this->fd);
  fread(&local_fc,2,1,(FILE *)this->fd);
  if (local_ca != 0x5d6) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_f8,"Magic number not present in ",filename);
    std::runtime_error::runtime_error(prVar2,(string *)&local_f8);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (2 < local_fa) {
    if (local_fc == 3) {
      std::istream::read((char *)infile,(long)&this->readsize);
      std::istream::read((char *)infile,(long)&local_d8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->read_tag,local_d8);
      std::istream::read((char *)infile,
                         (long)(this->read_tag).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start);
      __off = std::istream::tellg();
      this->readpos_offset = __off;
      fseek((FILE *)this->fd,__off,0);
      std::istream::seekg((long)infile,((int)this->readsize + 1) * (int)local_d8 * 2);
      poVar1 = sdglib::OutputLog(INFO,true);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"LinkedReadsDatastore open: ",0x1b);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,(filename->_M_dataplus)._M_p,filename->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  max read length: ",0x13);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," Total reads: ",0xe);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      return;
    }
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_98,(uint)local_fc);
    std::operator+(&local_c8,"File type supplied: ",&local_98);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_c8);
    local_f8._M_dataplus._M_p = (pointer)*plVar3;
    psVar4 = (size_type *)(plVar3 + 2);
    if ((size_type *)local_f8._M_dataplus._M_p == psVar4) {
      local_f8.field_2._M_allocated_capacity = *psVar4;
      local_f8.field_2._8_8_ = plVar3[3];
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar4;
    }
    local_f8._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::runtime_error::runtime_error(prVar2,(string *)&local_f8);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_70,(uint)local_fa);
  std::operator+(&local_98,"LinkedDS file version: ",&local_70);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
  local_c8._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_c8._M_dataplus._M_p == psVar4) {
    local_c8.field_2._M_allocated_capacity = *psVar4;
    local_c8.field_2._8_8_ = plVar3[3];
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  }
  else {
    local_c8.field_2._M_allocated_capacity = *psVar4;
  }
  local_c8._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::to_string(&local_50,3);
  std::operator+(&local_f8,&local_c8,&local_50);
  std::runtime_error::runtime_error(prVar2,(string *)&local_f8);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

LinkedReadsDatastore::LinkedReadsDatastore(WorkSpace &ws, std::string filename, std::ifstream &infile) : ws(ws), mapper(ws, *this) {
    uint64_t s;
    filename=filename;
    fd=fopen(filename.c_str(),"r");
    sdgMagic_t magic;
    sdgVersion_t version;
    SDG_FILETYPE type;
    fread((char *) &magic, sizeof(magic),1,fd);
    fread((char *) &version, sizeof(version),1,fd);
    fread((char *) &type, sizeof(type),1,fd);

    if (magic != SDG_MAGIC) {
        throw std::runtime_error("Magic number not present in " + filename);
    }

    if (version < min_compat) {
        throw std::runtime_error("LinkedDS file version: " + std::to_string(version) + " is not compatible with " + std::to_string(min_compat));
    }

    if (type != LinkedDS_FT) {
        throw std::runtime_error("File type supplied: " + std::to_string(type) + " is not compatible with LinkedDS_FT");
    }

    infile.read( (char *) &readsize,sizeof(readsize));
    infile.read( (char *) &s,sizeof(s));
    read_tag.resize(s);
    infile.read( (char *) read_tag.data(),sizeof(read_tag[0])*s);
    readpos_offset=infile.tellg();
    fseek(fd,readpos_offset,SEEK_SET);
    infile.seekg(2*s*(readsize+1),std::ios_base::cur);
    sdglib::OutputLog()<<"LinkedReadsDatastore open: "<<filename<<"  max read length: "<<readsize<<" Total reads: " <<size()<<std::endl;
}